

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_func_queue_examples.cpp
# Opt level: O1

void density_tests::
     LfFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
     ::func_queue_reentrant_consume_samples(ostream *param_1)

{
  LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  *pLVar1;
  ControlBlock *pCVar2;
  bool bVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  type return_value_1;
  type return_value;
  lf_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  queue;
  reentrant_consume_operation local_140;
  undefined1 local_128 [8];
  undefined1 local_120 [32];
  lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  local_100;
  
  local_100.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
  local_100.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .
  super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  .m_initial_page.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_100.m_queue.
  super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_1_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_1_>
            ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
              *)&local_100,(anon_class_1_0_00000001 *)&local_140);
  density::
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_2_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_2_>
            ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
              *)&local_100,(anon_class_1_0_00000001 *)&local_140);
  local_140.m_consume_data.m_queue =
       (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
        *)0x0;
  local_140.m_consume_data.m_control = (ControlBlock *)0x0;
  local_140.m_consume_data.m_next_ptr = 0;
  iVar5 = 0;
  do {
    density::
    lf_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::try_consume_impl((lf_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                        *)local_120,&local_100,&local_140);
    pCVar2 = local_140.m_consume_data.m_control;
    iVar4 = 0;
    if (local_120[4] != '\0') {
      iVar4 = local_120._0_4_;
    }
    iVar5 = iVar5 + iVar4;
  } while (local_120[4] != '\0');
  pLVar1 = local_140.m_consume_data.m_queue;
  if (iVar5 == 5) {
    for (; pLVar1 != (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                      *)pCVar2;
        pLVar1 = (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                  *)&(pLVar1->
                     super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     ).field_0x20) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 (char *)(pLVar1->
                         super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                         ).m_tail.super___atomic_base<unsigned_long>._M_i,
                 (pLVar1->
                 super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                 ).m_initial_page.super___atomic_base<unsigned_long>._M_i);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_140);
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::~lf_heter_queue((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                       *)&local_100);
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_initial_page.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
    ::
    emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_3_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_3_>
              ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
                *)&local_100,(anon_class_1_0_00000001 *)&local_140);
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
    ::
    emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_4_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_4_>
              ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
                *)&local_100,(anon_class_1_0_00000001 *)&local_140);
    iVar5 = 0;
    local_140.m_consume_data.m_next_ptr = 0;
    local_140.m_consume_data.m_queue =
         (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          *)0x0;
    local_140.m_consume_data.m_control = (ControlBlock *)0x0;
    local_120._16_8_ = 0;
    local_120._0_8_ = 0;
    local_120._8_8_ = 0;
    do {
      density::
      lf_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
      ::try_consume_impl_cached
                ((lf_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  *)local_128,&local_100,local_120);
      pCVar2 = local_140.m_consume_data.m_control;
      iVar4 = 0;
      if (local_128[4] != '\0') {
        iVar4 = local_128._0_4_;
      }
      iVar5 = iVar5 + iVar4;
    } while (local_128[4] != '\0');
    pLVar1 = local_140.m_consume_data.m_queue;
    if (iVar5 != 5) {
      __assert_fail("sum == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                    ,0x2f1,
                    "static void density_tests::LfFunctionQueueSamples<density::function_standard_erasure, density::concurrency_multiple, density::concurrency_multiple, density::consistency_relaxed>::func_queue_reentrant_consume_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                   );
    }
    for (; pLVar1 != (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                      *)pCVar2;
        pLVar1 = (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                  *)&(pLVar1->
                     super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     ).field_0x20) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 (char *)(pLVar1->
                         super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                         ).m_tail.super___atomic_base<unsigned_long>._M_i,
                 (pLVar1->
                 super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                 ).m_initial_page.super___atomic_base<unsigned_long>._M_i);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::consume_operation::~consume_operation((consume_operation *)local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_140);
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::~lf_heter_queue((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                       *)&local_100);
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_initial_page.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_140.m_consume_data.m_queue =
         (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          *)&local_100;
    local_140.m_consume_data.m_control = (ControlBlock *)&local_100;
    local_120._0_8_ = &local_100;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
    ::
    emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_1_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_1_&>
              ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
                *)&local_100,(anon_class_8_1_a8890831_for_func1 *)local_120);
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
    ::
    emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_2_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_2_&>
              ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
                *)&local_100,(anon_class_16_2_b7b7fce5 *)&local_140);
    do {
      bVar3 = density::
              lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
              ::try_reentrant_consume_impl(&local_100);
    } while (bVar3);
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::~lf_heter_queue(&local_100.m_queue);
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_tail.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0xffc0;
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_initial_page.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_100.m_queue.
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_128 = (undefined1  [8])&local_100;
    local_120._0_8_ = &local_100;
    local_120._8_8_ = &local_100;
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
    ::
    emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_3_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_3_&>
              ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
                *)&local_100,(anon_class_8_1_a8890831_for_func1 *)local_128);
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
    ::
    emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_4_,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_4_&>
              ((lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)0>
                *)&local_100,(anon_class_16_2_b7b7fce5 *)local_120);
    local_140.m_consume_data.m_queue =
         (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          *)0x0;
    local_140.m_consume_data.m_control = (ControlBlock *)0x0;
    local_140.m_consume_data.m_next_ptr = 0;
    do {
      bVar3 = density::
              lf_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
              ::try_reentrant_consume_impl_cached(&local_100,&local_140);
    } while (bVar3);
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::reentrant_consume_operation::~reentrant_consume_operation(&local_140);
    density::
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::~lf_heter_queue(&local_100.m_queue);
    return;
  }
  __assert_fail("sum == 5",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_func_queue_examples.cpp"
                ,0x2ca,
                "static void density_tests::LfFunctionQueueSamples<density::function_standard_erasure, density::concurrency_multiple, density::concurrency_multiple, density::consistency_relaxed>::func_queue_reentrant_consume_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
               );
}

Assistant:

static void func_queue_reentrant_consume_samples(std::ostream &)
        {
            using namespace density;

            {
                //! [lf_function_queue try_consume example 1]
                lf_function_queue<
                  int(std::vector<std::string> & vect),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                queue.push([](std::vector<std::string> & vect) {
                    vect.push_back("Hello");
                    return 2;
                });

                queue.push([](std::vector<std::string> & vect) {
                    vect.push_back(" world!");
                    return 3;
                });

                std::vector<std::string> strings;

                int sum = 0;
                while (auto const return_value = queue.try_consume(strings))
                {
                    sum += *return_value;
                }

                assert(sum == 5);

                for (auto const & str : strings)
                    std::cout << str;
                std::cout << std::endl;
                //! [lf_function_queue try_consume example 1]
            }
            {
                //! [lf_function_queue try_consume example 2]
                using Queue = lf_function_queue<
                  int(std::vector<std::string> & vect),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>;
                Queue queue;

                queue.push([](std::vector<std::string> & vect) {
                    vect.push_back("Hello");
                    return 2;
                });

                queue.push([](std::vector<std::string> & vect) {
                    vect.push_back(" world!");
                    return 3;
                });

                std::vector<std::string> strings;

                // providing a cached consume_operation gives better performances
                typename Queue::consume_operation consume;

                int sum = 0;
                while (auto const return_value = queue.try_consume(consume, strings))
                {
                    sum += *return_value;
                }

                assert(sum == 5);

                for (auto const & str : strings)
                    std::cout << str;
                std::cout << std::endl;
                //! [lf_function_queue try_consume example 2]
            }
            {
                //! [lf_function_queue try_reentrant_consume example 1]
                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                auto func1 = [&queue] {
                    std::cout << (queue.empty() ? "The queue is empty" : "The queue is not empty")
                              << std::endl;
                };

                auto func2 = [&queue, func1] { queue.push(func1); };

                queue.push(func1);
                queue.push(func2);

                /* The callable objects we are going to invoke will access the queue, so we
                    must use a reentrant consume. Note: during the invoke of the last function
                    the queue is empty to any observer. */
                while (queue.try_reentrant_consume())
                    ;

                // Output:
                // The queue is not empty
                // The queue is empty
                //! [lf_function_queue try_reentrant_consume example 1]
            }
            {
                //! [lf_function_queue try_reentrant_consume example 2]
                lf_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY,
                  CONSISTENCY_MODEL>
                  queue;

                auto func1 = [&queue] {
                    std::cout << (queue.empty() ? "The queue is empty" : "The queue is not empty")
                              << std::endl;
                };

                auto func2 = [&queue, func1] { queue.push(func1); };

                queue.push(func1);
                queue.push(func2);

                // providing a cached consume_operation gives much better performances
                typename decltype(queue)::reentrant_consume_operation consume;

                /* The callable objects we are going to invoke will access the queue, so we
                    must use a reentrant consume. Note: during the invoke of the last function
                    the queue is empty to any observer. */
                while (queue.try_reentrant_consume(consume))
                    ;

                // Output:
                // The queue is not empty
                // The queue is empty
                //! [lf_function_queue try_reentrant_consume example 2]
            }
        }